

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MatchedUnknownFieldTagTest_Test::TestBody
          (ComparisonTest_MatchedUnknownFieldTagTest_Test *this)

{
  char *message;
  string_view value;
  string_view value_00;
  AssertHelper AStack_48;
  AssertionResult gtest_ar;
  string local_30;
  
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown1_,0xf0,0x7a);
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown2_,0xf0,0x79);
  UnknownFieldSet::AddFixed32((this->super_ComparisonTest).unknown1_,0xf1,1);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown2_,0xf1,2);
  value._M_str = "cat";
  value._M_len = 3;
  UnknownFieldSet::AddLengthDelimited((this->super_ComparisonTest).unknown1_,0xf2,value);
  value_00._M_str = "dog";
  value_00._M_len = 3;
  UnknownFieldSet::AddLengthDelimited((this->super_ComparisonTest).unknown2_,0xf2,value_00);
  protobuf::(anonymous_namespace)::ComparisonTest::RunUn_abi_cxx11_(&local_30,this);
  testing::internal::CmpHelperEQ<char[125],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"modified: 240[0]: 122 -> 121\\n\" \"deleted: 241[0]: 0x00000001\\n\" \"added: 241[0]: 0x0000000000000002\\n\" \"modified: 242[0]: \\\"cat\\\" -> \\\"dog\\\"\\n\""
             ,"RunUn()",
             (char (*) [125])
             "modified: 240[0]: 122 -> 121\ndeleted: 241[0]: 0x00000001\nadded: 241[0]: 0x0000000000000002\nmodified: 242[0]: \"cat\" -> \"dog\"\n"
             ,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xe9c,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ComparisonTest, MatchedUnknownFieldTagTest) {
  unknown1_->AddVarint(240, 122);
  unknown2_->AddVarint(240, 121);
  unknown1_->AddFixed32(241, 1);
  unknown2_->AddFixed64(241, 2);
  unknown1_->AddLengthDelimited(242, "cat");
  unknown2_->AddLengthDelimited(242, "dog");

  EXPECT_EQ(
      "modified: 240[0]: 122 -> 121\n"
      "deleted: 241[0]: 0x00000001\n"
      "added: 241[0]: 0x0000000000000002\n"
      "modified: 242[0]: \"cat\" -> \"dog\"\n",
      RunUn());
}